

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clara.hpp
# Opt level: O1

void __thiscall
clara::detail::BasicResult<clara::detail::ParseResultType>::~BasicResult
          (BasicResult<clara::detail::ParseResultType> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_ResultValueBase<clara::detail::ParseResultType>).super_ResultBase._vptr_ResultBase =
       (_func_int **)&PTR__BasicResult_0011c4a0;
  pcVar2 = (this->m_errorMessage)._M_dataplus._M_p;
  paVar1 = &(this->m_errorMessage).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_ResultValueBase<clara::detail::ParseResultType>).super_ResultBase._vptr_ResultBase =
       (_func_int **)&PTR__ResultValueBase_0011c508;
  operator_delete(this,0x30);
  return;
}

Assistant:

explicit BasicResult( BasicResult<U> const &other )
        :   ResultValueBase<T>( other.type() ),
            m_errorMessage( other.errorMessage() )
        {
            assert( type() != ResultBase::Ok );
        }